

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLTest_EmptyCipherList_Test::~SSLTest_EmptyCipherList_Test
          (SSLTest_EmptyCipherList_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SSLTest, EmptyCipherList) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);

  // Initially, the cipher list is not empty.
  EXPECT_NE(0u, sk_SSL_CIPHER_num(SSL_CTX_get_ciphers(ctx.get())));

  // Configuring the empty cipher list fails.
  EXPECT_FALSE(SSL_CTX_set_cipher_list(ctx.get(), ""));
  ERR_clear_error();

  // But the cipher list is still updated to empty.
  EXPECT_EQ(0u, sk_SSL_CIPHER_num(SSL_CTX_get_ciphers(ctx.get())));
}